

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O0

void __thiscall net_uv::KCPSocket::startIdle(KCPSocket *this)

{
  uv_loop_t *loop;
  UVTimer *pUVar1;
  uint64_t uVar2;
  _func_void_uv_timer_t_ptr *cb;
  __0 local_11;
  KCPSocket *local_10;
  KCPSocket *this_local;
  
  local_10 = this;
  if (this->m_idle == (UVTimer *)0x0) {
    pUVar1 = (UVTimer *)malloc(0xa0);
    this->m_idle = pUVar1;
    UVTimer::UVTimer(this->m_idle);
  }
  uVar2 = uv_now((this->super_Socket).m_loop);
  this->m_idleUpdateTime = uVar2;
  pUVar1 = this->m_idle;
  loop = (this->super_Socket).m_loop;
  cb = startIdle()::$_0::operator_cast_to_function_pointer(&local_11);
  UVTimer::start(pUVar1,loop,cb,1,1,this);
  return;
}

Assistant:

void KCPSocket::startIdle()
{
	if (m_idle == NULL)
	{
		m_idle = (UVTimer*)fc_malloc(sizeof(UVTimer));
		new (m_idle) UVTimer();
	}

	m_idleUpdateTime = uv_now(m_loop);
	m_idle->start(m_loop, [](uv_timer_t* handle)
	{
		KCPSocket* svr = (KCPSocket*)handle->data;
		svr->idleLogic();
	}, 1, 1, this);
}